

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_circuit.cpp
# Opt level: O3

unique_ptr<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_> __thiscall
lsim::ModelCircuit::instantiate(ModelCircuit *this,Simulator *sim,bool top_level)

{
  ModelComponent *comp;
  ModelComponent *this_00;
  _Head_base<0UL,_lsim::SimCircuit_*,_false> _Var1;
  ModelCircuit *pMVar2;
  SimComponent *this_01;
  iterator iVar3;
  pin_id_t pin_a;
  pin_id_t pin_b;
  mapped_type *ppMVar4;
  undefined4 in_ECX;
  undefined7 in_register_00000011;
  Simulator *pSVar5;
  uint32_t index;
  pointer *ppuVar6;
  string name;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelComponent_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelComponent_*>_>_>
  via_lut;
  ModelCircuit *local_b0;
  undefined4 local_a4;
  _Head_base<0UL,_lsim::SimCircuit_*,_false> local_a0;
  SimComponent *local_98;
  Simulator *local_90;
  string local_88;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelComponent_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelComponent_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_a0._M_head_impl = (SimCircuit *)this;
  pMVar2 = (ModelCircuit *)operator_new(0x68);
  SimCircuit::SimCircuit
            ((SimCircuit *)pMVar2,(Simulator *)CONCAT71(in_register_00000011,top_level),
             (ModelCircuit *)sim);
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  pSVar5 = (Simulator *)
           (sim->m_init_components).
           super__Vector_base<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  local_b0 = pMVar2;
  local_a4 = in_ECX;
  do {
    if (pSVar5 == (Simulator *)0x0) {
      ppuVar6 = &(sim->m_pin_nodes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      while (_Var1._M_head_impl = local_a0._M_head_impl, ppuVar6 = (pointer *)*ppuVar6,
            ppuVar6 != (pointer *)0x0) {
        SimCircuit::add_wire((SimCircuit *)local_b0,(ModelWire *)ppuVar6[2]);
      }
      (local_a0._M_head_impl)->m_circuit_desc = local_b0;
      local_b0 = (ModelCircuit *)0x0;
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelComponent_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelComponent_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_68);
      if (local_b0 != (ModelCircuit *)0x0) {
        std::default_delete<lsim::SimCircuit>::operator()
                  ((default_delete<lsim::SimCircuit> *)&local_b0,(SimCircuit *)local_b0);
      }
      return (__uniq_ptr_data<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>,_true,_true>)
             (__uniq_ptr_data<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>,_true,_true>)
             _Var1._M_head_impl;
    }
    comp = *(ModelComponent **)
            ((long)&(pSVar5->m_components).
                    super__Vector_base<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>,_std::allocator<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>_>_>
                    ._M_impl.super__Vector_impl_data + 8);
    this_01 = SimCircuit::add_component((SimCircuit *)local_b0,comp);
    if (comp->m_type == 0x20) {
      ModelComponent::property_value_abi_cxx11_(&local_88,comp,"name","via");
      iVar3 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelComponent_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelComponent_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&local_68,&local_88);
      local_98 = this_01;
      local_90 = pSVar5;
      if (iVar3.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelComponent_*>,_true>
          ._M_cur == (__node_type *)0x0) {
        ppMVar4 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelComponent_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelComponent_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelComponent_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelComponent_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&local_68,&local_88);
        *ppMVar4 = comp;
      }
      else {
        this_00 = *(ModelComponent **)
                   ((long)iVar3.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelComponent_*>,_true>
                          ._M_cur + 0x28);
        if (comp->m_inputs != this_00->m_inputs) {
          __assert_fail("via_a->num_inputs() == via_b->num_inputs()",
                        "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/model_circuit.cpp"
                        ,0x196,
                        "auto lsim::ModelCircuit::instantiate(Simulator *, bool)::(anonymous class)::operator()(ModelComponent *, ModelComponent *) const"
                       );
        }
        if (comp->m_inputs != 0) {
          index = 0;
          do {
            pMVar2 = local_b0;
            pin_a = ModelComponent::input_pin_id(comp,index);
            pin_b = ModelComponent::input_pin_id(this_00,index);
            SimCircuit::connect_pins((SimCircuit *)pMVar2,pin_a,pin_b);
            index = index + 1;
          } while (index < comp->m_inputs);
        }
      }
      pSVar5 = local_90;
      this_01 = local_98;
      in_ECX = local_a4;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        pSVar5 = local_90;
        this_01 = local_98;
        in_ECX = local_a4;
      }
    }
    if (((char)in_ECX != '\0') && (comp->m_type == 1)) {
      SimComponent::enable_user_values(this_01);
    }
    pSVar5 = (Simulator *)pSVar5->m_time;
  } while( true );
}

Assistant:

std::unique_ptr<SimCircuit> ModelCircuit::instantiate(Simulator *sim, bool top_level) {
    auto instance = std::make_unique<SimCircuit>(sim, this);
    std::unordered_map<std::string, ModelComponent *> via_lut;

    // helper function to connect all pins of two vias
    auto connect_vias = [&instance](ModelComponent *via_a, ModelComponent *via_b) {
        assert(via_a->num_inputs() == via_b->num_inputs());
        for (uint32_t i = 0u; i < via_a->num_inputs(); ++i) {
            instance->connect_pins(via_a->input_pin_id(i), via_b->input_pin_id(i));
        }
    };

    for (auto &comp_it : m_components) {
        auto comp = comp_it.second.get();
        auto sim_comp = instance->add_component(comp);

        if (comp->type() == COMPONENT_VIA) {
            auto name = comp->property_value("name", "via");
            auto found = via_lut.find(name);
            if (found != via_lut.end()) {
                connect_vias(comp, found->second);
            } else {
                via_lut[name] = comp;
            }
        }

        if (top_level && comp->type() == COMPONENT_CONNECTOR_IN) {
            sim_comp->enable_user_values();
        }
    }

    for (auto &wire : m_wires) {
        instance->add_wire(wire.second.get());
    }

    return std::move(instance);
}